

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

void jsoncons::detail::prettify_string<jsoncons::string_sink<std::__cxx11::wstring>>
               (char *buffer,size_t length,int k,int min_exp,int max_exp,
               string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *result)

{
  uint uVar1;
  int iVar2;
  wchar_t wVar3;
  ulong uVar4;
  int i;
  uint uVar5;
  
  uVar5 = (uint)length;
  uVar1 = uVar5 + k;
  if ((int)uVar1 <= max_exp && -1 < k) {
    if (0 < (int)uVar5) {
      uVar4 = 0;
      do {
        std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
        uVar4 = uVar4 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar4);
    }
    if (0 < k) {
      do {
        std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
        uVar5 = (int)length + 1;
        length = (size_t)uVar5;
      } while ((int)uVar5 < (int)uVar1);
    }
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    return;
  }
  if ((int)uVar1 < 1 || max_exp < (int)uVar1) {
    if ((int)uVar1 <= min_exp || 0 < (int)uVar1) {
      std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
      wVar3 = (wchar_t)result->buf_ptr;
      if (uVar5 != 1) {
        std::__cxx11::wstring::push_back(wVar3);
        if (1 < (int)uVar5) {
          uVar4 = 1;
          do {
            std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
            uVar4 = uVar4 + 1;
          } while ((uVar5 & 0x7fffffff) != uVar4);
        }
        wVar3 = (wchar_t)result->buf_ptr;
      }
      std::__cxx11::wstring::push_back(wVar3);
      fill_exponent<jsoncons::string_sink<std::__cxx11::wstring>>(uVar1 - 1,result);
      return;
    }
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    if ((int)uVar1 < 0) {
      iVar2 = 3;
      if (3 < (int)(2 - uVar1)) {
        iVar2 = 2 - uVar1;
      }
      iVar2 = iVar2 + -2;
      do {
        std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    if (0 < (int)uVar5) {
      uVar4 = 0;
      do {
        std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
        uVar4 = uVar4 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar4);
    }
  }
  else {
    uVar4 = 0;
    do {
      std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
    if (k < 0) {
      do {
        std::__cxx11::wstring::push_back((wchar_t)result->buf_ptr);
        uVar1 = uVar1 + 1;
      } while ((int)uVar1 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void prettify_string(const char *buffer, std::size_t length, int k, int min_exp, int max_exp, Result& result)
    {
        int nb_digits = (int)length;
        int offset;
        /* v = buffer * 10^k
           kk is such that 10^(kk-1) <= v < 10^kk
           this way kk gives the position of the decimal point.
        */
        int kk = nb_digits + k;

        if (nb_digits <= kk && kk <= max_exp)
        {
            /* the first digits are already in. Add some 0s and call it a day. */
            /* the max_exp is a personal choice. Only 16 digits could possibly be relevant.
             * Basically we want to print 12340000000 rather than 1234.0e7 or 1.234e10 */
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            for (int i = nb_digits; i < kk; ++i)
            {
                result.push_back('0');
            }
            result.push_back('.');
            result.push_back('0');
        } 
        else if (0 < kk && kk <= max_exp)
        {
            /* comma number. Just insert a '.' at the correct location. */
            for (int i = 0; i < kk; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('.');
            for (int i = kk; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (min_exp < kk && kk <= 0)
        {
            offset = 2 - kk;

            result.push_back('0');
            result.push_back('.');
            for (int i = 2; i < offset; ++i) 
                result.push_back('0');
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (nb_digits == 1)
        {
            result.push_back(buffer[0]);
            result.push_back('e');
            fill_exponent(kk - 1, result);
        } 
        else
        {
            result.push_back(buffer[0]);
            result.push_back('.');
            for (int i = 1; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('e');
            fill_exponent(kk - 1, result);
        }
    }